

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O2

void sort_tables(ecs_world_t *world,ecs_query_t *query)

{
  int iVar1;
  ecs_compare_action_t compare;
  ecs_entity_t entity;
  ecs_table_t *table;
  long lVar2;
  ecs_column_t *peVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  int32_t iVar7;
  void *pvVar8;
  int32_t *piVar9;
  ecs_data_t *data;
  ecs_entity_t *entities;
  void *ptr;
  short offset;
  ulong uVar10;
  int32_t elem_size;
  ulong uVar11;
  bool bVar12;
  
  compare = query->compare;
  if (compare != (ecs_compare_action_t)0x0) {
    entity = query->sort_on_component;
    uVar5 = ecs_vector_count(query->tables);
    pvVar8 = _ecs_vector_first(query->tables,0x50,0x10);
    uVar11 = 0;
    uVar10 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar10 = uVar11;
    }
    bVar4 = false;
    for (; uVar10 * 0x50 != uVar11; uVar11 = uVar11 + 0x50) {
      table = *(ecs_table_t **)((long)pvVar8 + uVar11 + 8);
      lVar2 = *(long *)((long)pvVar8 + uVar11 + 0x40);
      if (lVar2 == 0) {
        piVar9 = ecs_table_get_monitor(table);
        *(int32_t **)((long)pvVar8 + uVar11 + 0x40) = piVar9;
      }
      piVar9 = ecs_table_get_dirty_state(table);
      if (lVar2 == 0) {
        bVar12 = true;
        iVar6 = -1;
        if (entity != 0) goto LAB_001189a0;
LAB_00118a13:
        data = ecs_table_get_data(table);
        bVar4 = true;
        if (((data != (ecs_data_t *)0x0) && (data->entities != (ecs_vector_t *)0x0)) &&
           (iVar7 = ecs_table_data_count(data), 1 < iVar7)) {
          entities = (ecs_entity_t *)_ecs_vector_first(data->entities,8,0x10);
          if (iVar6 == -1) {
            ptr = (void *)0x0;
            elem_size = 0;
          }
          else {
            peVar3 = data->columns;
            offset = peVar3[iVar6].alignment;
            if (offset < 0x11) {
              offset = 0x10;
            }
            elem_size = (int32_t)peVar3[iVar6].size;
            ptr = _ecs_vector_first(peVar3[iVar6].data,elem_size,offset);
          }
          qsort_array(world,table,data,entities,ptr,elem_size,0,iVar7 + -1,compare);
        }
      }
      else {
        iVar1 = **(int **)((long)pvVar8 + uVar11 + 0x40);
        bVar12 = *piVar9 != iVar1;
        if (entity == 0) {
          iVar6 = -1;
          if (*piVar9 != iVar1) goto LAB_00118a13;
        }
        else {
LAB_001189a0:
          iVar6 = ecs_type_index_of(table->type,entity);
          if (iVar6 != -1) {
            iVar7 = ecs_vector_count(table->type);
            _ecs_assert(iVar6 < iVar7,0xc,(char *)0x0,"index < ecs_vector_count(table->type)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                        ,0x596);
            iVar7 = ecs_vector_count(table->type);
            if (iVar7 <= iVar6) {
              __assert_fail("index < ecs_vector_count(table->type)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/query.c"
                            ,0x596,"void sort_tables(ecs_world_t *, ecs_query_t *)");
            }
            if ((bVar12) ||
               (piVar9[(long)iVar6 + 1] !=
                *(int *)(*(long *)((long)pvVar8 + uVar11 + 0x40) + 4 + (long)iVar6 * 4)))
            goto LAB_00118a13;
          }
        }
      }
    }
    if ((bVar4) || (query->match_count != query->prev_match_count)) {
      build_sorted_tables(query);
      query->match_count = query->match_count + 1;
    }
  }
  return;
}

Assistant:

static
void sort_tables(
    ecs_world_t *world,
    ecs_query_t *query)
{
    ecs_compare_action_t compare = query->compare;
    if (!compare) {
        return;
    }
    
    ecs_entity_t sort_on_component = query->sort_on_component;

    /* Iterate over active tables. Don't bother with inactive tables, since
     * they're empty */
    int32_t i, count = ecs_vector_count(query->tables);
    ecs_matched_table_t *tables = ecs_vector_first(
        query->tables, ecs_matched_table_t);
    bool tables_sorted = false;

    for (i = 0; i < count; i ++) {
        ecs_matched_table_t *table_data = &tables[i];
        ecs_table_t *table = table_data->iter_data.table;

        /* If no monitor had been created for the table yet, create it now */
        bool is_dirty = false;
        if (!table_data->monitor) {
            table_data->monitor = ecs_table_get_monitor(table);

            /* A new table is always dirty */
            is_dirty = true;
        }

        int32_t *dirty_state = ecs_table_get_dirty_state(table);

        is_dirty = is_dirty || (dirty_state[0] != table_data->monitor[0]);

        int32_t index = -1;
        if (sort_on_component) {
            /* Get index of sorted component. We only care if the component we're
            * sorting on has changed or if entities have been added / re(moved) */
            index = ecs_type_index_of(table->type, sort_on_component);
            if (index != -1) {
                ecs_assert(index < ecs_vector_count(table->type), ECS_INTERNAL_ERROR, NULL); 
                is_dirty = is_dirty || (dirty_state[index + 1] != table_data->monitor[index + 1]);
            } else {
                /* Table does not contain component which means the sorted
                 * component is shared. Table does not need to be sorted */
                continue;
            }
        }      
        
        /* Check both if entities have moved (element 0) or if the component
         * we're sorting on has changed (index + 1) */
        if (is_dirty) {
            /* Sort the table */
            sort_table(world, table, index, compare);
            tables_sorted = true;
        }
    }

    if (tables_sorted || query->match_count != query->prev_match_count) {
        build_sorted_tables(query);
        query->match_count ++; /* Increase version if tables changed */
    }
}